

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_type(lua_State *L)

{
  int t;
  char *s;
  lua_State *L_local;
  
  luaL_checkany(L,1);
  t = lua_type(L,1);
  s = lua_typename(L,t);
  lua_pushstring(L,s);
  return 1;
}

Assistant:

static int luaB_type(lua_State*L){
luaL_checkany(L,1);
lua_pushstring(L,luaL_typename(L,1));
return 1;
}